

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  bool bVar1;
  pointer ppSVar2;
  
  ppSVar2 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (ppSVar2 !=
         (this->FunctionScopes).
         super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = ScopePool::IsAlreadyLocked(*ppSVar2,filename);
    ppSVar2 = ppSVar2 + 1;
    if (bVar1) {
      return true;
    }
  }
  ppSVar2 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppSVar2 ==
        (this->FileScopes).
        super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = ScopePool::IsAlreadyLocked(&this->ProcessScope,filename);
      return bVar1;
    }
    bVar1 = ScopePool::IsAlreadyLocked(*ppSVar2,filename);
    ppSVar2 = ppSVar2 + 1;
  } while (!bVar1);
  return true;
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (CIt i = this->FunctionScopes.begin(); i != this->FunctionScopes.end();
       ++i) {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  for (CIt i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i) {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  return this->ProcessScope.IsAlreadyLocked(filename);
}